

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Printer::WriteRaw(Printer *this,char *data,int size)

{
  int iVar1;
  char *data_00;
  char *local_28;
  void *void_buffer;
  char *pcStack_18;
  int size_local;
  char *data_local;
  Printer *this_local;
  
  if (((this->failed_ & 1U) == 0) && (size != 0)) {
    void_buffer._4_4_ = size;
    pcStack_18 = data;
    data_local = &this->variable_delimiter_;
    if (((this->at_start_of_line_ & 1U) != 0) && ((0 < size && (*data != '\n')))) {
      this->at_start_of_line_ = false;
      data_00 = (char *)std::__cxx11::string::data();
      iVar1 = std::__cxx11::string::size();
      WriteRaw(this,data_00,iVar1);
      if ((this->failed_ & 1U) != 0) {
        return;
      }
    }
    while (this->buffer_size_ < void_buffer._4_4_) {
      memcpy(this->buffer_,pcStack_18,(long)this->buffer_size_);
      this->offset_ = (long)this->buffer_size_ + this->offset_;
      pcStack_18 = pcStack_18 + this->buffer_size_;
      void_buffer._4_4_ = void_buffer._4_4_ - this->buffer_size_;
      iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&local_28,&this->buffer_size_);
      this->failed_ = (bool)(((byte)iVar1 ^ 0xff) & 1);
      if ((this->failed_ & 1U) != 0) {
        return;
      }
      this->buffer_ = local_28;
    }
    memcpy(this->buffer_,pcStack_18,(long)void_buffer._4_4_);
    this->buffer_ = this->buffer_ + void_buffer._4_4_;
    this->buffer_size_ = this->buffer_size_ - void_buffer._4_4_;
    this->offset_ = (long)void_buffer._4_4_ + this->offset_;
  }
  return;
}

Assistant:

void Printer::WriteRaw(const char* data, int size) {
  if (failed_) return;
  if (size == 0) return;

  if (at_start_of_line_ && (size > 0) && (data[0] != '\n')) {
    // Insert an indent.
    at_start_of_line_ = false;
    WriteRaw(indent_.data(), indent_.size());
    if (failed_) return;
  }

  while (size > buffer_size_) {
    // Data exceeds space in the buffer.  Copy what we can and request a
    // new buffer.
    memcpy(buffer_, data, buffer_size_);
    offset_ += buffer_size_;
    data += buffer_size_;
    size -= buffer_size_;
    void* void_buffer;
    failed_ = !output_->Next(&void_buffer, &buffer_size_);
    if (failed_) return;
    buffer_ = reinterpret_cast<char*>(void_buffer);
  }

  // Buffer is big enough to receive the data; copy it.
  memcpy(buffer_, data, size);
  buffer_ += size;
  buffer_size_ -= size;
  offset_ += size;
}